

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qurlquery.cpp
# Opt level: O2

void __thiscall QUrlQuery::removeQueryItem(QUrlQuery *this,QString *key)

{
  QUrlQueryPrivate *this_00;
  iterator pos;
  iterator iVar1;
  
  if ((this->d).d.ptr != (QUrlQueryPrivate *)0x0) {
    this_00 = QSharedDataPointer<QUrlQueryPrivate>::data(&this->d);
    pos = QUrlQueryPrivate::findKey(this_00,key);
    iVar1 = QList<std::pair<QString,_QString>_>::end(&this_00->itemList);
    if (pos.i != iVar1.i) {
      QList<std::pair<QString,_QString>_>::erase(&this_00->itemList,(const_iterator)pos.i);
      return;
    }
  }
  return;
}

Assistant:

void QUrlQuery::removeQueryItem(const QString &key)
{
    if (d.constData()) {
        auto *p = d.data();
        Map::iterator it = p->findKey(key);
        if (it != p->itemList.end())
            p->itemList.erase(it);
    }
}